

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O1

BlockPointer __thiscall duckdb::MetadataWriter::GetBlockPointer(MetadataWriter *this)

{
  MetadataPointer MVar1;
  BlockManager *pBVar2;
  idx_t iVar3;
  uint uVar4;
  idx_t iVar5;
  idx_t iVar6;
  BlockPointer BVar7;
  
  if (this->capacity <= this->offset) {
    NextBlock(this);
  }
  iVar3 = this->offset;
  MVar1 = (this->block).pointer;
  pBVar2 = this->manager->block_manager;
  iVar5 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar2->block_header_size);
  uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    (iVar5 - iVar6 >> 6 & 0xfffffffffffffff8);
  BVar7.offset = MVar1._7_1_ * uVar4 + (int)iVar3;
  BVar7.block_id = (ulong)MVar1 & 0xffffffffffffff;
  BVar7.unused_padding = 0;
  return BVar7;
}

Assistant:

BlockPointer MetadataWriter::GetBlockPointer() {
	return MetadataManager::ToBlockPointer(GetMetaBlockPointer(), GetManager().GetMetadataBlockSize());
}